

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O2

void train(svm_params *params)

{
  _Rb_tree_header *p_Var1;
  svm_example *psVar2;
  svm_model *model;
  svm_model *psVar3;
  svm_example **ppsVar4;
  float *pfVar5;
  svm_example *this;
  bool bVar6;
  uint uVar7;
  size_t i;
  bool *train_pool;
  ulong uVar8;
  float *scores;
  _Base_ptr p_Var9;
  double *subopt;
  ostream *poVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  size_t sVar14;
  long lVar15;
  size_t train_size;
  size_t sVar16;
  ulong uVar17;
  size_t i_1;
  size_t i_3;
  float fVar18;
  float fVar19;
  pair<const_double,_const_unsigned_long> local_70;
  multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
  scoremap;
  
  train_pool = calloc_or_throw<bool>(params->pool_size);
  for (uVar8 = 0; uVar8 < params->pool_size; uVar8 = uVar8 + 1) {
    train_pool[uVar8] = false;
  }
  scores = calloc_or_throw<float>(params->pool_pos);
  predict(params,params->pool,scores,params->pool_pos);
  if (params->active != false) {
    if (params->active_pool_greedy == false) {
      for (uVar8 = 0; uVar8 < params->pool_pos; uVar8 = uVar8 + 1) {
        sVar16 = (params->pool[uVar8]->ex).example_counter;
        fVar18 = expf((float)SQRT(((double)CONCAT44(0x45300000,(int)(sVar16 >> 0x20)) -
                                  1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)sVar16) - 4503599627370496.0)) *
                      (float)((double)ABS(scores[uVar8]) * params->active_c));
        fVar19 = 2.0 / (fVar18 + 1.0);
        fVar18 = merand48(&params->all->random_state);
        if (fVar18 < fVar19) {
          (params->pool[uVar8]->ex).l.simple.weight =
               (1.0 / fVar19) * (params->pool[uVar8]->ex).l.simple.weight;
          train_pool[uVar8] = true;
        }
      }
    }
    else {
      p_Var1 = &scoremap._M_t._M_impl.super__Rb_tree_header;
      scoremap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      scoremap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      scoremap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      uVar8 = 0;
      scoremap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      scoremap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      for (; uVar8 < params->pool_pos; uVar8 = uVar8 + 1) {
        local_70.first = (double)ABS(scores[uVar8]);
        local_70.second = uVar8;
        std::
        _Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
        ::_M_emplace_equal<std::pair<double_const,unsigned_long_const>>
                  ((_Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                    *)&scoremap,&local_70);
      }
      p_Var9 = scoremap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (uVar8 = 1; ((_Rb_tree_header *)p_Var9 != p_Var1 && (uVar8 <= params->subsample));
          uVar8 = uVar8 + 1) {
        train_pool[(long)p_Var9[1]._M_parent] = true;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      }
      std::
      _Rb_tree<double,_std::pair<const_double,_unsigned_long>,_std::_Select1st<std::pair<const_double,_unsigned_long>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
      ::~_Rb_tree(&scoremap._M_t);
    }
  }
  if (params->para_active == true) {
    for (uVar8 = 0; uVar8 < params->pool_pos; uVar8 = uVar8 + 1) {
      if (train_pool[uVar8] == false) {
        psVar2 = params->pool[uVar8];
        if (psVar2 != (svm_example *)0x0) {
          svm_example::~svm_example(psVar2);
        }
        operator_delete(psVar2);
      }
    }
    sync_queries(params->all,params,train_pool);
  }
  if (params->all->training == false) {
    for (uVar8 = 0; uVar8 < params->pool_pos; uVar8 = uVar8 + 1) {
      psVar2 = params->pool[uVar8];
      if (psVar2 != (svm_example *)0x0) {
        svm_example::~svm_example(psVar2);
      }
      operator_delete(psVar2);
    }
  }
  else {
    model = params->model;
    for (uVar8 = 0; uVar8 < params->pool_pos; uVar8 = uVar8 + 1) {
      if (((params->active != true) || (train_pool[uVar8] == true)) &&
         (uVar7 = add(params,params->pool[uVar8]), -1 < (int)uVar7)) {
        bVar6 = update(params,(ulong)uVar7);
        subopt = calloc_or_throw<double>(model->num_support);
        uVar13 = 0;
        while ((uVar13 < params->reprocess && (model->num_support != 0))) {
          fVar18 = merand48(&params->all->random_state);
          if (0.5 <= fVar18) {
            sVar16 = suboptimality(model,subopt);
            if (0.0 < subopt[sVar16]) {
              if (((!bVar6) && (uVar13 == 0)) && ((sVar16 == uVar7 && (sVar16 != 0)))) {
                poVar10 = std::operator<<(&(params->all->trace_message).super_ostream,
                                          "Shouldn\'t reprocess right after process!!!");
                std::endl<char,std::char_traits<char>>(poVar10);
              }
              uVar11 = model->num_support * sVar16;
              if (uVar11 < params->maxcache || uVar11 - params->maxcache == 0) {
                psVar3 = params->model;
                uVar11 = psVar3->num_support;
                if (uVar11 <= sVar16) {
                  poVar10 = std::operator<<(&(params->all->trace_message).super_ostream,
                                            "Internal error at ");
                  poVar10 = std::operator<<(poVar10,
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/kernel_svm.cc"
                                           );
                  poVar10 = std::operator<<(poVar10,":");
                  poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x99);
                  std::endl<char,std::char_traits<char>>(poVar10);
                }
                psVar2 = (psVar3->support_vec)._begin[sVar16];
                svm_example::compute_kernels(psVar2,params);
                fVar18 = (psVar3->alpha)._begin[sVar16];
                fVar19 = (psVar3->delta)._begin[sVar16];
                sVar14 = sVar16;
                while (sVar12 = sVar14 - 1, sVar14 != 0) {
                  ppsVar4 = (psVar3->support_vec)._begin;
                  ppsVar4[sVar14] = ppsVar4[sVar12];
                  pfVar5 = (psVar3->alpha)._begin;
                  pfVar5[sVar14] = pfVar5[sVar12];
                  pfVar5 = (psVar3->delta)._begin;
                  pfVar5[sVar14] = pfVar5[sVar12];
                  sVar14 = sVar12;
                }
                *(psVar3->support_vec)._begin = psVar2;
                *(psVar3->alpha)._begin = fVar18;
                *(psVar3->delta)._begin = fVar19;
                for (uVar17 = 0; uVar17 != uVar11; uVar17 = uVar17 + 1) {
                  this = (psVar3->support_vec)._begin[uVar17];
                  pfVar5 = (this->krow)._begin;
                  if (sVar16 < (ulong)((long)(this->krow)._end - (long)pfVar5 >> 2)) {
                    fVar18 = pfVar5[sVar16];
                    sVar14 = sVar16;
                    while (sVar14 != 0) {
                      pfVar5 = (this->krow)._begin;
                      pfVar5[sVar14] = pfVar5[sVar14 - 1];
                      sVar14 = sVar14 - 1;
                    }
                  }
                  else {
                    fVar18 = (psVar2->krow)._begin[uVar17];
                    scoremap._M_t._M_impl._0_4_ = 0;
                    v_array<float>::push_back(&this->krow,(float *)&scoremap);
                    lVar15 = ((long)(this->krow)._end - (long)(this->krow)._begin >> 2) + -1;
                    while (lVar15 != 0) {
                      pfVar5 = (this->krow)._begin;
                      pfVar5[lVar15] = pfVar5[lVar15 + -1];
                      lVar15 = lVar15 + -1;
                    }
                  }
                  *(this->krow)._begin = fVar18;
                }
              }
              goto LAB_001c0d1a;
            }
          }
          else {
            fVar18 = merand48(&params->all->random_state);
            fVar18 = floorf(fVar18 * (float)model->num_support);
            sVar16 = (long)(fVar18 - 9.223372e+18) & (long)fVar18 >> 0x3f | (long)fVar18;
LAB_001c0d1a:
            update(params,sVar16);
          }
          uVar13 = uVar13 + 1;
        }
        free(subopt);
      }
    }
  }
  free(scores);
  free(train_pool);
  return;
}

Assistant:

void train(svm_params& params)
{
  // params.all->opts_n_args.trace_message<<"In train "<<params.all->training<<endl;

  bool* train_pool = calloc_or_throw<bool>(params.pool_size);
  for (size_t i = 0; i < params.pool_size; i++) train_pool[i] = false;

  float* scores = calloc_or_throw<float>(params.pool_pos);
  predict(params, params.pool, scores, params.pool_pos);
  // cout<<scores[0]<<endl;

  if (params.active)
  {
    if (params.active_pool_greedy)
    {
      multimap<double, size_t> scoremap;
      for (size_t i = 0; i < params.pool_pos; i++)
        scoremap.insert(pair<const double, const size_t>(fabs(scores[i]), i));

      multimap<double, size_t>::iterator iter = scoremap.begin();
      // params.all->opts_n_args.trace_message<<params.pool_size<<" "<<"Scoremap: ";
      // for(;iter != scoremap.end();iter++)
      // params.all->opts_n_args.trace_message<<iter->first<<" "<<iter->second<<"
      // "<<((label_data*)params.pool[iter->second]->ld)->label<<"\t"; params.all->opts_n_args.trace_message<<endl;
      iter = scoremap.begin();

      for (size_t train_size = 1; iter != scoremap.end() && train_size <= params.subsample; train_size++)
      {
        // params.all->opts_n_args.trace_message<<train_size<<" "<<iter->second<<" "<<iter->first<<endl;
        train_pool[iter->second] = 1;
        iter++;
      }
    }
    else
    {
      for (size_t i = 0; i < params.pool_pos; i++)
      {
        float queryp = 2.0f /
            (1.0f +
                expf(
                    (float)(params.active_c * fabs(scores[i])) * (float)pow(params.pool[i]->ex.example_counter, 0.5f)));
        if (merand48(params.all->random_state) < queryp)
        {
          svm_example* fec = params.pool[i];
          fec->ex.l.simple.weight *= 1 / queryp;
          train_pool[i] = 1;
        }
      }
    }
    // free(scores);
  }

  if (params.para_active)
  {
    for (size_t i = 0; i < params.pool_pos; i++)
      if (!train_pool[i])
        delete params.pool[i];
    sync_queries(*(params.all), params, train_pool);
  }

  if (params.all->training)
  {
    svm_model* model = params.model;

    for (size_t i = 0; i < params.pool_pos; i++)
    {
      // params.all->opts_n_args.trace_message<<"process: "<<i<<" "<<train_pool[i]<<endl;;
      int model_pos = -1;
      if (params.active)
      {
        if (train_pool[i])
        {
          // params.all->opts_n_args.trace_message<<"i = "<<i<<"train_pool[i] = "<<train_pool[i]<<"
          // "<<params.pool[i]->example_counter<<endl;
          model_pos = add(params, params.pool[i]);
        }
      }
      else
        model_pos = add(params, params.pool[i]);

      // params.all->opts_n_args.trace_message<<"Added: "<<model_pos<<"
      // "<<model->support_vec[model_pos]->example_counter<<endl; cout<<"After adding in train
      // "<<model->num_support<<endl;

      if (model_pos >= 0)
      {
        bool overshoot = update(params, model_pos);
        // cout<<model_pos<<":alpha = "<<model->alpha[model_pos]<<endl;

        double* subopt = calloc_or_throw<double>(model->num_support);
        for (size_t j = 0; j < params.reprocess; j++)
        {
          if (model->num_support == 0)
            break;
          // cout<<"reprocess: ";
          int randi = 1;
          if (merand48(params.all->random_state) < 0.5)
            randi = 0;
          if (randi)
          {
            size_t max_pos = suboptimality(model, subopt);
            if (subopt[max_pos] > 0)
            {
              if (!overshoot && max_pos == (size_t)model_pos && max_pos > 0 && j == 0)
                params.all->trace_message << "Shouldn't reprocess right after process!!!" << endl;
              // cout<<max_pos<<" "<<subopt[max_pos]<<endl;
              // cout<<params.model->support_vec[0]->example_counter<<endl;
              if (max_pos * model->num_support <= params.maxcache)
                make_hot_sv(params, max_pos);
              update(params, max_pos);
            }
          }
          else
          {
            size_t rand_pos = (size_t)floorf(merand48(params.all->random_state) * model->num_support);
            update(params, rand_pos);
          }
        }
        // cout<<endl;
        // cout<<params.model->support_vec[0]->example_counter<<endl;
        free(subopt);
      }
    }
  }
  else
    for (size_t i = 0; i < params.pool_pos; i++) delete params.pool[i];

  // params.all->opts_n_args.trace_message<<params.model->support_vec[0]->example_counter<<endl;
  // for(int i = 0;i < params.pool_size;i++)
  //   params.all->opts_n_args.trace_message<<scores[i]<<" ";
  // params.all->opts_n_args.trace_message<<endl;
  free(scores);
  // params.all->opts_n_args.trace_message<<params.model->support_vec[0]->example_counter<<endl;
  free(train_pool);
  // params.all->opts_n_args.trace_message<<params.model->support_vec[0]->example_counter<<endl;
}